

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O1

QString * __thiscall
QAccessibleButton::text(QString *__return_storage_ptr__,QAccessibleButton *this,Text t)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  bool bVar3;
  QPushButton *this_00;
  QAbstractButton *pQVar4;
  QWidget *this_01;
  longlong __tmp;
  long lVar5;
  long in_FS_OFFSET;
  QString local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (t == Name) {
    this_01 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
    QWidget::accessibleName(&local_58,this_01);
    pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    *(undefined4 *)&(__return_storage_ptr__->d).d = local_58.d.d._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_58.d.d._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_58.d.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_58.d.ptr._4_4_;
    lVar5 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_58.d.size;
    local_58.d.d = (Data *)pQVar1;
    local_58.d.ptr = pcVar2;
    local_58.d.size = lVar5;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
    if ((__return_storage_ptr__->d).size != 0) goto LAB_0052d43c;
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    pQVar4 = (QAbstractButton *)QMetaObject::cast((QObject *)&QAbstractButton::staticMetaObject);
    QAbstractButton::text(&local_70,pQVar4);
    qt_accStripAmp(&local_58,&local_70);
  }
  else {
    if (t != Accelerator) goto LAB_0052d43c;
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    this_00 = (QPushButton *)QMetaObject::cast((QObject *)&QPushButton::staticMetaObject);
    if (this_00 != (QPushButton *)0x0) {
      bVar3 = QPushButton::isDefault(this_00);
      if (bVar3) {
        QKeySequence::QKeySequence((QKeySequence *)&local_70,0x1000005,0,0,0);
        QKeySequence::toString((SequenceFormat)&local_58);
        pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
        pcVar2 = (__return_storage_ptr__->d).ptr;
        (__return_storage_ptr__->d).d = local_58.d.d;
        (__return_storage_ptr__->d).ptr = local_58.d.ptr;
        lVar5 = (__return_storage_ptr__->d).size;
        (__return_storage_ptr__->d).size = local_58.d.size;
        local_58.d.d = (Data *)pQVar1;
        local_58.d.ptr = pcVar2;
        local_58.d.size = lVar5;
        if (pQVar1 != (QArrayData *)0x0) {
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar1,2,0x10);
          }
        }
        QKeySequence::~QKeySequence((QKeySequence *)&local_70);
      }
    }
    if ((__return_storage_ptr__->d).size != 0) goto LAB_0052d43c;
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    pQVar4 = (QAbstractButton *)QMetaObject::cast((QObject *)&QAbstractButton::staticMetaObject);
    QAbstractButton::text(&local_70,pQVar4);
    qt_accHotKey(&local_58,&local_70);
  }
  lVar5 = 0;
  pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
  pcVar2 = (__return_storage_ptr__->d).ptr;
  (__return_storage_ptr__->d).d = local_58.d.d;
  (__return_storage_ptr__->d).ptr = local_58.d.ptr;
  (__return_storage_ptr__->d).size = local_58.d.size;
  local_58.d.d = (Data *)pQVar1;
  local_58.d.ptr = pcVar2;
  local_58.d.size = lVar5;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0052d43c:
  lVar5 = (__return_storage_ptr__->d).size;
  if (lVar5 == 0) {
    QAccessibleWidget::text(&local_58,&this->super_QAccessibleWidget,t);
    pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_58.d.d;
    (__return_storage_ptr__->d).ptr = local_58.d.ptr;
    (__return_storage_ptr__->d).size = local_58.d.size;
    local_58.d.d = (Data *)pQVar1;
    local_58.d.ptr = pcVar2;
    local_58.d.size = lVar5;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleButton::text(QAccessible::Text t) const
{
    QString str;
    switch (t) {
    case QAccessible::Accelerator:
    {
#if QT_CONFIG(shortcut) && QT_CONFIG(pushbutton)
        QPushButton *pb = qobject_cast<QPushButton*>(object());
        if (pb && pb->isDefault())
            str = QKeySequence(Qt::Key_Enter).toString(QKeySequence::NativeText);
#endif
        if (str.isEmpty())
            str = qt_accHotKey(button()->text());
    }
         break;
    case QAccessible::Name:
        str = widget()->accessibleName();
        if (str.isEmpty())
            str = qt_accStripAmp(button()->text());
        break;
    default:
        break;
    }
    if (str.isEmpty())
        str = QAccessibleWidget::text(t);
    return str;
}